

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_file_utilities.cpp
# Opt level: O0

bool __thiscall
ON_FileIterator::Initialize(ON_FileIterator *this,wchar_t *directory_name,wchar_t *item_name_filter)

{
  bool bVar1;
  int iVar2;
  wchar_t *dir_seps;
  ON_wString local_directory_name;
  ON_wString local_30;
  ON_wString local_item_name_filter;
  wchar_t *item_name_filter_local;
  wchar_t *directory_name_local;
  ON_FileIterator *this_local;
  
  local_item_name_filter.m_s = item_name_filter;
  ON_wString::ON_wString(&local_30,item_name_filter);
  local_item_name_filter.m_s = ON_wString::operator_cast_to_wchar_t_(&local_30);
  ON_wString::ON_wString((ON_wString *)&dir_seps,directory_name);
  ON_wString::TrimRight((ON_wString *)&dir_seps,L"/\\");
  iVar2 = ON_wString::Length((ON_wString *)&dir_seps);
  if ((iVar2 < 1) || (bVar1 = ON_wString::IsEmpty((ON_wString *)&dir_seps), bVar1)) {
    ON_wString::operator=((ON_wString *)&dir_seps,directory_name);
  }
  Reset(this);
  ON_wString::operator=((ON_wString *)(this + 8),(ON_wString *)&dir_seps);
  ON_wString::operator=((ON_wString *)(this + 0x10),&local_30);
  bVar1 = ON_wString::IsEmpty((ON_wString *)(this + 8));
  if (!bVar1) {
    *(undefined4 *)this = 1;
  }
  this_local._7_1_ = !bVar1;
  ON_wString::~ON_wString((ON_wString *)&dir_seps);
  ON_wString::~ON_wString(&local_30);
  return this_local._7_1_;
}

Assistant:

bool ON_FileIterator::Initialize( 
  const wchar_t* directory_name, 
  const wchar_t* item_name_filter
  )
{
  const ON_wString local_item_name_filter(item_name_filter);
  item_name_filter = local_item_name_filter;

  ON_wString local_directory_name(directory_name);
  {
    const wchar_t* dir_seps = L"/\\";
    local_directory_name.TrimRight(dir_seps);
    if ( local_directory_name.Length() <= 0 || local_directory_name.IsEmpty() )
      local_directory_name = directory_name;
  }

  Reset();
  m_directory = local_directory_name;
  m_item_name_filter = local_item_name_filter;
  if (m_directory.IsEmpty())
    return false;
  m_state = 1;
  return true;
}